

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

TriStateResult QFileSystemEngine::cloneFile(int srcfd,int dstfd,QFileSystemMetaData *knownData)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  TriStateResult TVar4;
  long in_FS_OFFSET;
  stat64 statBuffer;
  stat64 local_b0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_b0,0xaa,0x90);
  if (((knownData->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x72a67077) == 0x72a67077) {
    if (((knownData->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
         super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x20000) == 0) {
      if (((knownData->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x40000) == 0)
      goto LAB_00172294;
      piVar3 = __errno_location();
      *piVar3 = 0x15;
      goto LAB_0017235c;
    }
    local_b0.st_mode = 0x8000;
  }
  else {
LAB_00172294:
    iVar1 = fstat64(srcfd,&local_b0);
    if (iVar1 == -1) {
LAB_0017235c:
      TVar4 = Failed;
      goto LAB_0017235f;
    }
    TVar4 = NotSupported;
    if ((local_b0.st_mode & 0xf000) != 0x8000) goto LAB_0017235f;
  }
  iVar1 = ioctl(dstfd,0x40049409,srcfd);
  TVar4 = Success;
  if (iVar1 != 0) {
    lVar2 = sendfile(dstfd,srcfd,(off_t *)0x0,0x7ffff000);
    if (lVar2 == -1) {
      piVar3 = __errno_location();
      TVar4 = -(*piVar3 != 5 && *piVar3 != 0x1c);
    }
    else {
      do {
        if (lVar2 == 0) goto LAB_0017235f;
        lVar2 = sendfile(dstfd,srcfd,(off_t *)0x0,0x7ffff000);
      } while (lVar2 != -1);
      TVar4 = Failed;
      ftruncate(dstfd,0);
      lseek(srcfd,0,0);
      lseek(dstfd,0,0);
    }
  }
LAB_0017235f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return TVar4;
  }
  __stack_chk_fail();
}

Assistant:

auto QFileSystemEngine::cloneFile(int srcfd, int dstfd, const QFileSystemMetaData &knownData) -> TriStateResult
{
    QT_STATBUF statBuffer;
    if (knownData.hasFlags(QFileSystemMetaData::PosixStatFlags) &&
            knownData.isFile()) {
        statBuffer.st_mode = S_IFREG;
    } else if (knownData.hasFlags(QFileSystemMetaData::PosixStatFlags) &&
               knownData.isDirectory()) {
        errno = EISDIR;
        return TriStateResult::Failed;   // fcopyfile(3) returns success on directories
    } else if (QT_FSTAT(srcfd, &statBuffer) == -1) {
        // errno was set
        return TriStateResult::Failed;
    } else if (!S_ISREG((statBuffer.st_mode))) {
        // not a regular file, let QFile do the copy
        return TriStateResult::NotSupported;
    }

    [[maybe_unused]] auto destinationIsEmpty = [dstfd]() {
        QT_STATBUF statBuffer;
        return QT_FSTAT(dstfd, &statBuffer) == 0 && statBuffer.st_size == 0;
    };
    Q_ASSERT(destinationIsEmpty());

#if defined(Q_OS_LINUX)
    // first, try FICLONE (only works on regular files and only on certain fs)
    if (::ioctl(dstfd, FICLONE, srcfd) == 0)
        return TriStateResult::Success;
#elif defined(Q_OS_DARWIN)
    // try fcopyfile
    if (fcopyfile(srcfd, dstfd, nullptr, COPYFILE_DATA | COPYFILE_STAT) == 0)
        return TriStateResult::Success;
    switch (errno) {
    case ENOTSUP:
    case ENOMEM:
        return TriStateResult::NotSupported;    // let QFile try
    }
    return TriStateResult::Failed;
#endif

#if QT_CONFIG(copy_file_range)
    // Second, try copy_file_range. Tested on Linux & FreeBSD: FreeBSD can copy
    // across mountpoints, Linux currently (6.12) can only if the source and
    // destination mountpoints are the same filesystem type.
    QT_OFF_T srcoffset = 0;
    QT_OFF_T dstoffset = 0;
    ssize_t copied;
    do {
        copied = ::copy_file_range(srcfd, &srcoffset, dstfd, &dstoffset, SSIZE_MAX, 0);
    } while (copied > 0 || (copied < 0 && errno == EINTR));
    if (copied == 0)
        return TriStateResult::Success;         // EOF -> success
    if (srcoffset) {
        // some bytes were copied, so this is a real error (like ENOSPC).
        copied = ftruncate(dstfd, 0);
        return TriStateResult::Failed;
    }
    if (errno != EXDEV)
        return TriStateResult::Failed;
#endif

#if defined(Q_OS_LINUX)
    // For Linux, try sendfile (it can send to some special types too).
    // sendfile(2) is limited in the kernel to 2G - 4k
    const size_t SendfileSize = 0x7ffff000;

    ssize_t n = ::sendfile(dstfd, srcfd, nullptr, SendfileSize);
    if (n == -1) {
        switch (errno) {
        case ENOSPC:
        case EIO:
            return TriStateResult::Failed;
        }

        // if we got an error here, give up and try at an upper layer
        return TriStateResult::NotSupported;
    }

    while (n) {
        n = ::sendfile(dstfd, srcfd, nullptr, SendfileSize);
        if (n == -1) {
            // uh oh, this is probably a real error (like ENOSPC)
            n = ftruncate(dstfd, 0);
            n = lseek(srcfd, 0, SEEK_SET);
            n = lseek(dstfd, 0, SEEK_SET);
            return TriStateResult::Failed;
        }
    }

    return TriStateResult::Success;
#else
    Q_UNUSED(dstfd);
    return TriStateResult::NotSupported;
#endif
}